

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puppet.hpp
# Opt level: O3

void __thiscall henson::Puppet::~Puppet(Puppet *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppcVar2;
  pointer pcVar3;
  pointer ppcVar4;
  
  if ((this->super_Coroutine<henson::Puppet>).super_BaseCoroutine.running_ == true) {
    (this->super_Coroutine<henson::Puppet>).super_BaseCoroutine.stop_ = 1;
    Coroutine<henson::Puppet>::proceed(&this->super_Coroutine<henson::Puppet>);
  }
  ppcVar2 = (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar4 = (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppcVar4 != ppcVar2; ppcVar4 = ppcVar4 + 1) {
    if (*ppcVar4 != (char *)0x0) {
      operator_delete__(*ppcVar4);
    }
  }
  dlclose(this->lib_);
  ppcVar4 = (this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar4 != (pointer)0x0) {
    operator_delete(ppcVar4,(long)(this->argv_).super__Vector_base<char_*,_std::allocator<char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar4)
    ;
  }
  pcVar3 = (this->filename_)._M_dataplus._M_p;
  paVar1 = &(this->filename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  Coroutine<henson::Puppet>::~Coroutine(&this->super_Coroutine<henson::Puppet>);
  return;
}

Assistant:

~Puppet()
                        {
                            if(running_)
                            {
                                signal_stop();
                                proceed();
                            }

                            for (char* a : argv_)
                                delete[] a;

                            dlclose(lib_);
                        }